

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::findDirWatcher(DirWatcherGeneric *this,string *dir)

{
  __type _Var1;
  DirWatcherGeneric *pDVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  string sStack_48;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &this->DirSnap,dir);
  if (!_Var1) {
    for (p_Var3 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      pDVar2 = *(DirWatcherGeneric **)(p_Var3 + 2);
      std::__cxx11::string::string((string *)&sStack_48,(string *)dir);
      pDVar2 = findDirWatcher(pDVar2,&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
      if (pDVar2 != (DirWatcherGeneric *)0x0) {
        return pDVar2;
      }
    }
    this = (DirWatcherGeneric *)0x0;
  }
  return this;
}

Assistant:

DirWatcherGeneric * DirWatcherGeneric::findDirWatcher( std::string dir )
{
	if ( DirSnap.DirectoryInfo.Filepath == dir )
	{
		return this;
	}
	else
	{
		DirWatcherGeneric * watcher = NULL;

		for ( DirWatchMap::iterator it = Directories.begin(); it != Directories.end(); it++ )
		{
			watcher = it->second->findDirWatcher( dir );

			if ( NULL != watcher )
			{
				return watcher;
			}
		}
	}

	return NULL;
}